

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_help.c
# Opt level: O2

void cfg_help_int(autobuf *out,int64_t min,int64_t max,uint16_t bytelen,uint16_t fraction)

{
  undefined6 in_register_0000000a;
  ulong uVar1;
  ulong uVar2;
  isonumber_str *piVar3;
  char *fmt;
  undefined6 in_register_00000082;
  uint64_t scaling;
  bool bVar4;
  isonumber_str hbuf2;
  isonumber_str hbuf1;
  
  uVar1 = CONCAT62(in_register_0000000a,bytelen);
  uVar2 = CONCAT62(in_register_00000082,fraction) & 0xffffffff;
  scaling = 1;
  while (bVar4 = uVar2 != 0, uVar2 = uVar2 - 1, bVar4) {
    scaling = scaling * 10;
  }
  uVar2 = 0x7fffffffffffffff >> ((char)bytelen * -8 + 0x40U & 0x3f);
  isonumber_from_s64(&hbuf1,min,"",scaling,true);
  isonumber_from_s64(&hbuf2,max,"",scaling,true);
  if (-0x8000000000000000 >> ((char)bytelen * -8 & 0x3fU) < min) {
    if (max < (long)uVar2) {
      cfg_append_printable_line
                (out,
                 "    Parameter must be a %d-byte fractional integer between %s and %s with a maximum of %d fractional digits"
                 ,uVar1 & 0xffffffff,&hbuf1,&hbuf2);
      return;
    }
    fmt = 
    "    Parameter must be a %d-byte fractional integer larger or equal than %s with a maximum of %d fractional digits"
    ;
    piVar3 = &hbuf1;
  }
  else {
    if ((long)uVar2 <= max) {
      cfg_append_printable_line
                (out,
                 "    Parameter must be a %d-byte signed integer with a maximum of %d fractional digits"
                 ,uVar1 & 0xffffffff,(ulong)fraction);
      return;
    }
    fmt = 
    "    Parameter must be a %d-byte fractional integer smaller or equal than %s with a maximum of %d fractional digits"
    ;
    piVar3 = &hbuf2;
  }
  cfg_append_printable_line(out,fmt,uVar1 & 0xffffffff,piVar3,(ulong)fraction);
  return;
}

Assistant:

void
cfg_help_int(struct autobuf *out, int64_t min, int64_t max, uint16_t bytelen, uint16_t fraction) {
  struct isonumber_str hbuf1, hbuf2;
  int64_t min64, max64;
  uint64_t j, scaling;

  min64 = INT64_MIN >> (8 * (8 - bytelen));
  max64 = INT64_MAX >> (8 * (8 - bytelen));

  for (j = 0, scaling = 1; j < fraction; j++, scaling*=10);

  /* get string representation of min/max */
  isonumber_from_s64(&hbuf1, min, "", scaling, true);
  isonumber_from_s64(&hbuf2, max, "", scaling, true);

  if (min > min64) {
    if (max < max64) {
      cfg_append_printable_line(out,
        CFG_HELP_INDENT_PREFIX "Parameter must be a %d-byte fractional integer"
                               " between %s and %s with a maximum of %d fractional digits",
        bytelen, hbuf1.buf, hbuf2.buf, fraction );
    }
    else {
      cfg_append_printable_line(out,
        CFG_HELP_INDENT_PREFIX "Parameter must be a %d-byte fractional integer"
                               " larger or equal than %s with a maximum of %d fractional digits",
        bytelen, hbuf1.buf, fraction );
    }
  }
  else {
    if (max < max64) {
      cfg_append_printable_line(out,
        CFG_HELP_INDENT_PREFIX "Parameter must be a %d-byte fractional integer"
                               " smaller or equal than %s with a maximum of %d fractional digits",
        bytelen, hbuf2.buf, fraction );
    }
    else {
      cfg_append_printable_line(out,
        CFG_HELP_INDENT_PREFIX "Parameter must be a %d-byte signed integer"
                               " with a maximum of %d fractional digits",
        bytelen, fraction );
    }
  }
}